

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.hpp
# Opt level: O1

void __thiscall VolumeFile::reset(VolumeFile *this)

{
  pointer pSVar1;
  pointer puVar2;
  pointer puVar3;
  char cVar4;
  StreamDesc *dataStream;
  pointer pSVar5;
  
  (this->m_origPath).m_pathname._M_string_length = 0;
  *(this->m_origPath).m_pathname._M_dataplus._M_p = '\0';
  (this->m_basePath).m_pathname._M_string_length = 0;
  *(this->m_basePath).m_pathname._M_dataplus._M_p = '\0';
  (this->m_baseName).m_pathname._M_string_length = 0;
  *(this->m_baseName).m_pathname._M_dataplus._M_p = '\0';
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    std::ifstream::close();
  }
  pSVar1 = (this->m_dataStreams).
           super__Vector_base<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pSVar5 = (this->m_dataStreams).
                super__Vector_base<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>.
                _M_impl.super__Vector_impl_data._M_start; pSVar5 != pSVar1; pSVar5 = pSVar5 + 1) {
    cVar4 = std::__basic_file<char>::is_open();
    if (cVar4 != '\0') {
      std::ifstream::close();
    }
  }
  std::vector<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>::_M_erase_at_end
            (&this->m_dataStreams,
             (this->m_dataStreams).
             super__Vector_base<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>.
             _M_impl.super__Vector_impl_data._M_start);
  this->m_mainFileSize = 0;
  puVar2 = (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  puVar3 = (this->m_entryTreeOffsets).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_entryTreeOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar3) {
    (this->m_entryTreeOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar3;
  }
  this->m_nameTreeOffset = 0;
  this->m_extTreeOffset = 0;
  this->m_nodeTreeOffset = 0;
  this->m_entryTreeCount = 0;
  this->m_dataOffset = 0;
  return;
}

Assistant:

virtual void reset()
	{
		m_origPath.clear();
		m_basePath.clear();
		m_baseName.clear();

		if (m_mainStream.is_open()) {
			m_mainStream.close();
		}

		for (auto& dataStream: m_dataStreams) {
			if (!dataStream.stream.is_open()) {
				continue;
			}
			dataStream.stream.close();
		}
		m_dataStreams.clear();

		m_mainFileSize = 0;

		m_data.clear();
		m_entryTreeOffsets.clear();

		m_nameTreeOffset = m_extTreeOffset = 0;
		m_nodeTreeOffset = m_entryTreeCount = 0;

		m_dataOffset = 0;
	}